

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::Read
          (PosixRandomAccessFile *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  _func_int **pp_Var1;
  int __fd;
  ssize_t sVar2;
  int *piVar3;
  ssize_t sVar4;
  void *in_R9;
  long in_FS_OFFSET;
  Status *status;
  _func_int **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(offset + 8) == '\0') {
    __fd = open(*(char **)(offset + 0x18),0x80000);
    if (__fd < 0) {
      piVar3 = __errno_location();
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        PosixError((anon_unknown_1 *)this,(string *)(offset + 0x18),*piVar3);
        return (Status)this;
      }
      goto LAB_00665acb;
    }
  }
  else {
    __fd = *(int *)(offset + 0xc);
  }
  if (__fd == -1) {
    __assert_fail("fd != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                  ,0xb7,
                  "virtual Status leveldb::(anonymous namespace)::PosixRandomAccessFile::Read(uint64_t, size_t, Slice *, char *) const"
                 );
  }
  (this->super_RandomAccessFile)._vptr_RandomAccessFile = (_func_int **)0x0;
  sVar2 = pread(__fd,in_R9,(size_t)result,n);
  sVar4 = 0;
  if (0 < sVar2) {
    sVar4 = sVar2;
  }
  *(void **)scratch = in_R9;
  *(ssize_t *)(scratch + 8) = sVar4;
  if (sVar2 < 0) {
    piVar3 = __errno_location();
    PosixError((anon_unknown_1 *)&local_40,(string *)(offset + 0x18),*piVar3);
    pp_Var1 = (this->super_RandomAccessFile)._vptr_RandomAccessFile;
    (this->super_RandomAccessFile)._vptr_RandomAccessFile = local_40;
    local_40 = pp_Var1;
    if (pp_Var1 != (_func_int **)0x0) {
      operator_delete__(pp_Var1);
    }
  }
  if (*(char *)(offset + 8) == '\0') {
    if (__fd == *(int *)(offset + 0xc)) {
      __assert_fail("fd != fd_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0xc2,
                    "virtual Status leveldb::(anonymous namespace)::PosixRandomAccessFile::Read(uint64_t, size_t, Slice *, char *) const"
                   );
    }
    close(__fd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)this;
  }
LAB_00665acb:
  __stack_chk_fail();
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result,
              char* scratch) const override {
    int fd = fd_;
    if (!has_permanent_fd_) {
      fd = ::open(filename_.c_str(), O_RDONLY | kOpenBaseFlags);
      if (fd < 0) {
        return PosixError(filename_, errno);
      }
    }

    assert(fd != -1);

    Status status;
    ssize_t read_size = ::pread(fd, scratch, n, static_cast<off_t>(offset));
    *result = Slice(scratch, (read_size < 0) ? 0 : read_size);
    if (read_size < 0) {
      // An error: return a non-ok status.
      status = PosixError(filename_, errno);
    }
    if (!has_permanent_fd_) {
      // Close the temporary file descriptor opened earlier.
      assert(fd != fd_);
      ::close(fd);
    }
    return status;
  }